

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O2

Expression *
slang::ast::ReplicationExpression::fromSyntax
          (Compilation *compilation,MultipleConcatenationExpressionSyntax *syntax,
          ASTContext *context)

{
  bool bVar1;
  bitwidth_t value;
  Expression *pEVar2;
  ReplicationExpression *args_2;
  ReplicationExpression *expr;
  SourceLocation location;
  Diagnostic *diag;
  Diagnostic *diag_00;
  optional<int> value_00;
  optional<unsigned_int> oVar3;
  Type *pTVar4;
  _Storage<int,_true> _Var5;
  SourceRange SVar6;
  undefined1 in_stack_fffffffffffffc0c [12];
  Expression *right;
  ReplicationExpression *local_3d8;
  SVInt local_3d0;
  SVInt local_3c0;
  ConstantValue leftVal;
  EvalContext evalCtx;
  
  pEVar2 = Expression::selfDetermined
                     (compilation,(syntax->expression).ptr,context,
                      (bitmask<slang::ast::ASTFlags>)0x0);
  args_2 = (ReplicationExpression *)
           Expression::create(compilation,(ExpressionSyntax *)(syntax->concatenation).ptr,context,
                              (bitmask<slang::ast::ASTFlags>)0x0,(Type *)0x0);
  pTVar4 = compilation->errorType;
  right = (Expression *)args_2;
  evalCtx.astCtx._0_16_ = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  expr = BumpAllocator::
         emplace<slang::ast::ReplicationExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression&,slang::SourceRange>
                   (&compilation->super_BumpAllocator,pTVar4,pEVar2,(Expression *)args_2,
                    (SourceRange *)&evalCtx);
  bVar1 = Expression::bad(pEVar2);
  if ((bVar1) || (bVar1 = Expression::bad((Expression *)args_2), bVar1)) {
LAB_003c7d2b:
    pEVar2 = Expression::badExpr(compilation,&expr->super_Expression);
    return pEVar2;
  }
  bVar1 = Type::isIntegral((pEVar2->type).ptr);
  if ((!bVar1) ||
     ((bVar1 = Type::isIntegral((right->type).ptr), !bVar1 &&
      (bVar1 = Type::isString((right->type).ptr), !bVar1)))) {
    evalCtx.astCtx._0_16_ =
         slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)(syntax->concatenation).ptr);
    location = parsing::Token::location((Token *)&evalCtx);
    diag = ASTContext::addDiag(context,(DiagCode)0x260007,location);
    diag_00 = ast::operator<<(diag,(pEVar2->type).ptr);
    ast::operator<<(diag_00,(right->type).ptr);
    Diagnostic::operator<<(diag,pEVar2->sourceRange);
    Diagnostic::operator<<(diag,right->sourceRange);
    goto LAB_003c7d2b;
  }
  evalCtx.astCtx.assertionInstance = context->assertionInstance;
  evalCtx.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.data_ =
       (pointer)evalCtx.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.firstElement;
  evalCtx.astCtx.scope.ptr = context->scope;
  evalCtx.astCtx.lookupIndex = context->lookupIndex;
  evalCtx.astCtx._12_4_ = *(undefined4 *)&context->field_0xc;
  evalCtx.astCtx.flags.m_bits = (context->flags).m_bits;
  evalCtx.astCtx.instanceOrProc = context->instanceOrProc;
  evalCtx.astCtx.firstTempVar = context->firstTempVar;
  evalCtx.astCtx.randomizeDetails = context->randomizeDetails;
  evalCtx.flags.m_bits = '\x02';
  evalCtx._60_8_ = 0;
  evalCtx._68_8_ = 0;
  evalCtx.queueTarget._4_4_ = 0;
  evalCtx.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.len = 0;
  evalCtx.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.cap = 2;
  evalCtx.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.data_ =
       (pointer)evalCtx.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.firstElement;
  evalCtx.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.len = 0;
  evalCtx.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.cap = 5;
  evalCtx.diags.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.
  data_ = (pointer)evalCtx.diags.super_SmallVector<slang::Diagnostic,_2UL>.
                   super_SmallVectorBase<slang::Diagnostic>.firstElement;
  evalCtx.diags.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.
  len = 0;
  evalCtx.diags.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.
  cap = 2;
  evalCtx.warnings.super_SmallVector<slang::Diagnostic,_2UL>.
  super_SmallVectorBase<slang::Diagnostic>.data_ =
       (pointer)evalCtx.warnings.super_SmallVector<slang::Diagnostic,_2UL>.
                super_SmallVectorBase<slang::Diagnostic>.firstElement;
  evalCtx.warnings.super_SmallVector<slang::Diagnostic,_2UL>.
  super_SmallVectorBase<slang::Diagnostic>.len = 0;
  evalCtx.warnings.super_SmallVector<slang::Diagnostic,_2UL>.
  super_SmallVectorBase<slang::Diagnostic>.cap = 2;
  evalCtx.disableRange.startLoc = (SourceLocation)0x0;
  evalCtx.disableRange.endLoc = (SourceLocation)0x0;
  evalCtx.backtraceReported = false;
  local_3d8 = expr;
  Expression::eval(&leftVal,pEVar2,&evalCtx);
  if (leftVal.value.
      super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ._M_index == '\0') {
    bVar1 = Expression::isImplicitString(right);
    args_2 = local_3d8;
    if (bVar1) {
      SVar6._4_12_ = in_stack_fffffffffffffc0c;
      SVar6.startLoc._0_4_ = 1;
      Expression::contextDetermined
                ((Expression *)context,(ASTContext *)&right,(Expression **)local_3d8,
                 (Expression *)compilation->stringType,(Type *)0x0,SVar6,Implicit);
      args_2->concat_ = right;
      (args_2->super_Expression).type.ptr = compilation->stringType;
    }
    else {
      EvalContext::reportAllDiags(&evalCtx);
      args_2 = (ReplicationExpression *)Expression::badExpr(compilation,&args_2->super_Expression);
    }
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       *)&leftVal);
  if (leftVal.value.
      super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ._M_index == '\0') goto LAB_003c7ee7;
  value_00 = ASTContext::evalInteger(context,pEVar2,(bitmask<slang::ast::EvalFlags>)0x0);
  args_2 = local_3d8;
  if (((ulong)value_00.super__Optional_base<int,_true,_true>._M_payload.
              super__Optional_payload_base<int> >> 0x20 & 1) != 0) {
    _Var5._M_value =
         value_00.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>
         ._M_payload;
    if (-1 < _Var5._M_value) {
      if (_Var5._M_value == 0) {
        if (((context->flags).m_bits & 1) == 0) {
          ASTContext::addDiag(context,(DiagCode)0x930007,pEVar2->sourceRange);
          goto LAB_003c7e04;
        }
        pTVar4 = compilation->voidType;
      }
      else {
        Expression::selfDetermined(context,&right);
        args_2->concat_ = right;
        bVar1 = Type::isString((right->type).ptr);
        if (bVar1) {
          pTVar4 = compilation->stringType;
        }
        else {
          SVInt::SVInt(&local_3c0,0x20,(ulong)(_Var5._M_value & 0x7fffffff),true);
          value = Type::getBitWidth((right->type).ptr);
          SVInt::SVInt<unsigned_int>(&local_3d0,value);
          SVInt::operator*((SVInt *)&leftVal,&local_3c0);
          SVar6 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
          oVar3 = ASTContext::requireValidBitWidth(context,(SVInt *)&leftVal,SVar6);
          SVInt::~SVInt((SVInt *)&leftVal);
          SVInt::~SVInt(&local_3d0);
          SVInt::~SVInt(&local_3c0);
          if (((ulong)oVar3.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                      super__Optional_payload_base<unsigned_int> & 0x100000000) == 0) {
            args_2 = (ReplicationExpression *)
                     Expression::badExpr(compilation,&args_2->super_Expression);
            goto LAB_003c7ee7;
          }
          bVar1 = Type::isFourState((right->type).ptr);
          pTVar4 = Compilation::getType
                             (compilation,
                              oVar3.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                              super__Optional_payload_base<unsigned_int>._M_payload,
                              (bitmask<slang::ast::IntegralFlags>)(bVar1 * '\x02'));
        }
      }
      (args_2->super_Expression).type.ptr = pTVar4;
      goto LAB_003c7ee7;
    }
    ASTContext::requireGtZero(context,value_00,pEVar2->sourceRange);
  }
LAB_003c7e04:
  args_2 = (ReplicationExpression *)Expression::badExpr(compilation,&args_2->super_Expression);
LAB_003c7ee7:
  EvalContext::~EvalContext(&evalCtx);
  return &args_2->super_Expression;
}

Assistant:

Expression& ReplicationExpression::fromSyntax(Compilation& compilation,
                                              const MultipleConcatenationExpressionSyntax& syntax,
                                              const ASTContext& context) {
    Expression& left = selfDetermined(compilation, *syntax.expression, context);
    Expression* right = &create(compilation, *syntax.concatenation, context);

    auto result = compilation.emplace<ReplicationExpression>(compilation.getErrorType(), left,
                                                             *right, syntax.sourceRange());
    if (left.bad() || right->bad())
        return badExpr(compilation, result);

    if (!left.type->isIntegral() || (!right->type->isIntegral() && !right->type->isString())) {
        auto& diag = context.addDiag(diag::BadReplicationExpression,
                                     syntax.concatenation->getFirstToken().location());
        diag << *left.type << *right->type;
        diag << left.sourceRange;
        diag << right->sourceRange;
        return badExpr(compilation, result);
    }

    // If the multiplier isn't constant this must be a string replication.
    EvalContext evalCtx(context, EvalFlags::CacheResults);
    if (ConstantValue leftVal = left.eval(evalCtx); !leftVal) {
        if (!right->isImplicitString()) {
            // They probably meant for this to be a constant (non-string) replication,
            // so do the normal error reporting for that case.
            evalCtx.reportAllDiags();
            return badExpr(compilation, result);
        }

        contextDetermined(context, right, result, compilation.getStringType(), {});

        result->concat_ = right;
        result->type = &compilation.getStringType();
        return *result;
    }

    std::optional<int32_t> count = context.evalInteger(left);
    if (!count)
        return badExpr(compilation, result);

    if (*count < 0) {
        context.requireGtZero(count, left.sourceRange);
        return badExpr(compilation, result);
    }

    if (*count == 0) {
        if (!context.flags.has(ASTFlags::InsideConcatenation)) {
            context.addDiag(diag::ReplicationZeroOutsideConcat, left.sourceRange);
            return badExpr(compilation, result);
        }

        // Use a placeholder type here to indicate to the parent concatenation that this had a
        // zero width.
        result->type = &compilation.getVoidType();
        return *result;
    }

    selfDetermined(context, right);
    result->concat_ = right;

    if (right->type->isString()) {
        result->type = &compilation.getStringType();
        return *result;
    }

    auto width = context.requireValidBitWidth(
        SVInt(32, uint64_t(*count), true) * right->type->getBitWidth(), syntax.sourceRange());
    if (!width)
        return badExpr(compilation, result);

    result->type = &compilation.getType(*width, right->type->isFourState()
                                                    ? IntegralFlags::FourState
                                                    : IntegralFlags::TwoState);
    return *result;
}